

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.h
# Opt level: O0

int av1_get_dy(int angle)

{
  int angle_local;
  int local_4;
  
  if ((angle < 0x5b) || (0xb3 < angle)) {
    if ((angle < 0xb5) || (0x10d < angle)) {
      local_4 = 1;
    }
    else {
      local_4 = (int)dr_intra_derivative[0x10e - angle];
    }
  }
  else {
    local_4 = (int)dr_intra_derivative[angle + -0x5a];
  }
  return local_4;
}

Assistant:

static inline int av1_get_dy(int angle) {
  if (angle > 90 && angle < 180) {
    return dr_intra_derivative[angle - 90];
  } else if (angle > 180 && angle < 270) {
    return dr_intra_derivative[270 - angle];
  } else {
    // In this case, we are not really going to use dy. We may return any value.
    return 1;
  }
}